

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O0

ulong __thiscall CTcSymFunc::get_code_pool_addr(CTcSymFunc *this)

{
  long in_RDI;
  undefined8 local_8;
  
  if ((*(byte *)(in_RDI + 0x90) & 1) == 0) {
    local_8 = CTcStreamAnchor::get_addr(*(CTcStreamAnchor **)(in_RDI + 0x30));
  }
  else {
    local_8 = *(ulong *)(in_RDI + 0x88);
  }
  return local_8;
}

Assistant:

ulong CTcSymFunc::get_code_pool_addr() const
{
    /* check for an absolute address */
    if (abs_addr_valid_)
    {
        /* 
         *   we have an absolute address - this means the symbol was
         *   loaded from a fully-linked image file (specifically, from the
         *   debug records) 
         */
        return abs_addr_;
    }
    else
    {
        /* 
         *   we don't have an absolute address, so our address must have
         *   been determined through a linking step - get the final
         *   address from the anchor 
         */
        return anchor_->get_addr();
    }
}